

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O2

bool Security::DontEncode(Opnd *opnd)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  IntConstOpnd *pIVar4;
  ListOpnd *pLVar5;
  undefined4 *puVar6;
  AddrOpnd *pAVar7;
  IndirOpnd *pIVar8;
  int i;
  long lVar9;
  undefined1 uVar10;
  
  OVar2 = IR::Opnd::GetKind(opnd);
  switch(OVar2) {
  case OpndKindIntConst:
    pIVar4 = IR::Opnd::AsIntConstOpnd(opnd);
    uVar10 = pIVar4->m_dontEncode;
    break;
  case OpndKindInt64Const:
    uVar10 = 0;
    break;
  case OpndKindAddr:
    pAVar7 = IR::Opnd::AsAddrOpnd(opnd);
    uVar10 = 1;
    if (((pAVar7->field_0x28 & 1) == 0) &&
       (((pAVar7->addrOpndKind == AddrOpndKindDynamicVar ||
         (pAVar7->addrOpndKind == AddrOpndKindConstantVar)) && (pAVar7->m_address != (Var)0x0)))) {
      bVar3 = Js::TaggedNumber::Is(pAVar7->m_address);
      uVar10 = !bVar3;
    }
    break;
  case OpndKindIndir:
    pIVar8 = IR::Opnd::AsIndirOpnd(opnd);
    uVar10 = 1;
    if ((pIVar8->super_Opnd).field_0xe == '\0') {
      uVar10 = pIVar8->m_offset == 0;
    }
    break;
  default:
    if (OVar2 == OpndKindList) {
      pLVar5 = IR::Opnd::AsListOpnd(opnd);
      lVar9 = 0;
      do {
        if (pLVar5->count <= lVar9) {
          return true;
        }
        bVar3 = DontEncode(&pLVar5->opnds[lVar9]->super_Opnd);
        lVar9 = lVar9 + 1;
      } while (bVar3);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                         ,0x136,
                         "(opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); }))"
                         ,
                         "opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); })"
                        );
      if (bVar3) {
        *puVar6 = 0;
        return true;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  case OpndKindFloatConst:
  case OpndKindFloat32Const:
  case OpndKindSimd128Const:
  case OpndKindHelperCall:
  case OpndKindSym:
  case OpndKindReg:
    uVar10 = 1;
  }
  return (bool)uVar10;
}

Assistant:

bool
Security::DontEncode(IR::Opnd *opnd)
{
    switch (opnd->GetKind())
    {
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();
        return intConstOpnd->m_dontEncode;
    }

    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        return (addrOpnd->m_dontEncode ||
            !addrOpnd->IsVar() ||
            addrOpnd->m_address == nullptr ||
            !Js::TaggedNumber::Is(addrOpnd->m_address));
    }
    case IR::OpndKindIndir:
    {
        IR::IndirOpnd *indirOpnd = opnd->AsIndirOpnd();
        return indirOpnd->m_dontEncode || indirOpnd->GetOffset() == 0;
    }
    case IR::OpndKindInt64Const:
        return false;
    case IR::OpndKindList:
    {
        // We should only have RegOpnd in the ListOpnd therefore, we don't need to encode anything
        Assert(opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); }));
        return true;
    }
    default:
        return true;
    }
}